

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.hpp
# Opt level: O0

long __thiscall relive::ReLiveDB::getConfigValue<long>(ReLiveDB *this,string *key,long *defaultVal)

{
  long *in_RDX;
  long val;
  istringstream is;
  ostringstream os;
  long local_368;
  string local_360 [32];
  string local_340 [24];
  string *in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffce0;
  ReLiveDB *in_stack_fffffffffffffce8;
  ostringstream local_190 [376];
  long *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,*local_18);
  std::__cxx11::ostringstream::str();
  getConfigValueString
            (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)&stack0xfffffffffffffce0,local_340,_S_in);
  std::__cxx11::string::~string(local_340);
  std::__cxx11::string::~string(local_360);
  std::istream::operator>>(&stack0xfffffffffffffce0,&local_368);
  std::__cxx11::istringstream::~istringstream((istringstream *)&stack0xfffffffffffffce0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return local_368;
}

Assistant:

T getConfigValue(const std::string& key, const T& defaultVal = T())
    {
        std::ostringstream os;
        os << defaultVal;
        std::istringstream is(getConfigValueString(key, os.str()));
        T val;
        is >> val;
        return val;
    }